

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

bool __thiscall
cmMakefile::HaveCxxStandardAvailable(cmMakefile *this,cmTarget *target,string *feature)

{
  pointer pcVar1;
  bool bVar2;
  string *psVar3;
  char **ppcVar4;
  char *pcVar5;
  ostream *poVar6;
  size_t sVar7;
  char **ppcVar8;
  pointer __s;
  bool needCxx20;
  bool needCxx17;
  bool needCxx14;
  bool needCxx11;
  bool needCxx98;
  ostringstream e;
  bool local_215;
  bool local_214;
  bool local_213;
  bool local_212;
  bool local_211;
  string local_210;
  cmTarget *local_1f0;
  long *local_1e8 [2];
  long local_1d8 [2];
  long *local_1c8 [2];
  long local_1b8 [2];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  pcVar1 = local_1a8 + 0x10;
  local_1f0 = target;
  local_1a8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"CMAKE_CXX_STANDARD_DEFAULT","");
  psVar3 = GetDef(this,(string *)local_1a8);
  if (psVar3 == (string *)0x0) {
    __s = (char *)0x0;
  }
  else {
    __s = (psVar3->_M_dataplus)._M_p;
  }
  if ((pointer)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if (__s == (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "CMAKE_CXX_STANDARD_DEFAULT is not set.  COMPILE_FEATURES support not fully configured for this compiler."
               ,0x68);
    std::__cxx11::stringbuf::str();
    IssueMessage(this,INTERNAL_ERROR,&local_210);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    bVar2 = true;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1c8,__s,(allocator<char> *)local_1a8);
    ppcVar4 = std::find_if<char_const*const*,cmStrCmp>
                        (CXX_STANDARDS,(char **)&cmMSVC60LinkLineComputer::vtable,
                         (cmStrCmp *)local_1c8);
    if (local_1c8[0] != local_1b8) {
      operator_delete(local_1c8[0],local_1b8[0] + 1);
    }
    if (ppcVar4 == (char **)&cmMSVC60LinkLineComputer::vtable) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "The CMAKE_CXX_STANDARD_DEFAULT variable contains an invalid value: \"",0x44);
      sVar7 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar7);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\".",2);
      std::__cxx11::stringbuf::str();
      IssueMessage(this,INTERNAL_ERROR,&local_210);
    }
    else {
      local_211 = false;
      local_212 = false;
      local_213 = false;
      local_214 = false;
      local_215 = false;
      CheckNeededCxxLanguage(this,feature,&local_211,&local_212,&local_213,&local_214,&local_215);
      local_1a8._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CXX_STANDARD","");
      pcVar5 = cmTarget::GetProperty(local_1f0,(string *)local_1a8);
      if ((pointer)local_1a8._0_8_ != pcVar1) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if (pcVar5 != (char *)0x0) {
        __s = pcVar5;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1e8,__s,(allocator<char> *)local_1a8);
      ppcVar4 = std::find_if<char_const*const*,cmStrCmp>
                          (CXX_STANDARDS,(char **)&cmMSVC60LinkLineComputer::vtable,
                           (cmStrCmp *)local_1e8);
      if (local_1e8[0] != local_1d8) {
        operator_delete(local_1e8[0],local_1d8[0] + 1);
      }
      if (ppcVar4 != (char **)&cmMSVC60LinkLineComputer::vtable) {
        if (local_215 == false) {
          if (local_214 == false) {
            if (local_213 == false) {
              if (local_212 == false) {
                ppcVar8 = (char **)0x0;
                if (local_211 != false) {
                  ppcVar8 = CXX_STANDARDS;
                }
              }
              else {
                ppcVar8 = CXX_STANDARDS + 1;
              }
            }
            else {
              ppcVar8 = CXX_STANDARDS + 2;
            }
          }
          else {
            ppcVar8 = CXX_STANDARDS + 3;
          }
        }
        else {
          ppcVar8 = CXX_STANDARDS + 4;
        }
        return ppcVar8 <= ppcVar4;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"The CXX_STANDARD property on target \"",0x25);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(local_1f0->Name)._M_dataplus._M_p,
                          (local_1f0->Name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,"\" contained an invalid value: \"",0x1f);
      sVar7 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,__s,sVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\".",2);
      std::__cxx11::stringbuf::str();
      IssueMessage(this,FATAL_ERROR,&local_210);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool cmMakefile::HaveCxxStandardAvailable(cmTarget const* target,
                                          const std::string& feature) const
{
  const char* defaultCxxStandard =
    this->GetDefinition("CMAKE_CXX_STANDARD_DEFAULT");
  if (!defaultCxxStandard) {
    std::ostringstream e;
    e << "CMAKE_CXX_STANDARD_DEFAULT is not set.  COMPILE_FEATURES support "
         "not fully configured for this compiler.";
    this->IssueMessage(MessageType::INTERNAL_ERROR, e.str());
    // Return true so the caller does not try to lookup the default standard.
    return true;
  }
  if (std::find_if(cm::cbegin(CXX_STANDARDS), cm::cend(CXX_STANDARDS),
                   cmStrCmp(defaultCxxStandard)) == cm::cend(CXX_STANDARDS)) {
    std::ostringstream e;
    e << "The CMAKE_CXX_STANDARD_DEFAULT variable contains an "
         "invalid value: \""
      << defaultCxxStandard << "\".";
    this->IssueMessage(MessageType::INTERNAL_ERROR, e.str());
    return false;
  }

  bool needCxx98 = false;
  bool needCxx11 = false;
  bool needCxx14 = false;
  bool needCxx17 = false;
  bool needCxx20 = false;
  this->CheckNeededCxxLanguage(feature, needCxx98, needCxx11, needCxx14,
                               needCxx17, needCxx20);

  const char* existingCxxStandard = target->GetProperty("CXX_STANDARD");
  if (!existingCxxStandard) {
    existingCxxStandard = defaultCxxStandard;
  }

  const char* const* existingCxxLevel =
    std::find_if(cm::cbegin(CXX_STANDARDS), cm::cend(CXX_STANDARDS),
                 cmStrCmp(existingCxxStandard));
  if (existingCxxLevel == cm::cend(CXX_STANDARDS)) {
    std::ostringstream e;
    e << "The CXX_STANDARD property on target \"" << target->GetName()
      << "\" contained an invalid value: \"" << existingCxxStandard << "\".";
    this->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return false;
  }

  /* clang-format off */
  const char* const* needCxxLevel =
    needCxx20 ? &CXX_STANDARDS[4]
    : needCxx17 ? &CXX_STANDARDS[3]
    : needCxx14 ? &CXX_STANDARDS[2]
    : needCxx11 ? &CXX_STANDARDS[1]
    : needCxx98 ? &CXX_STANDARDS[0]
    : nullptr;
  /* clang-format on */

  return !needCxxLevel || needCxxLevel <= existingCxxLevel;
}